

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsComponentCompare(FmsComponent lhs,FmsComponent rhs)

{
  int iVar1;
  long lVar2;
  long lVar3;
  FmsInt FVar4;
  long *in_RSI;
  long *in_RDI;
  FmsInt j;
  _FmsPart_private *rpart;
  _FmsPart_private *lpart;
  FmsInt i;
  FmsInt np;
  int diff;
  void *in_stack_00000040;
  void *in_stack_00000048;
  FmsInt in_stack_00000050;
  FmsIntType in_stack_0000005c;
  ulong local_48;
  FmsDomain in_stack_ffffffffffffffd0;
  FmsDomain in_stack_ffffffffffffffd8;
  uint local_1c;
  uint local_4;
  
  if (in_RDI == in_RSI) {
    local_4 = 0;
  }
  else if (in_RDI == (long *)0x0) {
    local_4 = 0xffffffff;
  }
  else if (in_RSI == (long *)0x0) {
    local_4 = 0xfffffffe;
  }
  else {
    local_1c = 0;
    if ((*in_RDI == 0) || (*in_RSI == 0)) {
      if (*in_RDI == 0) {
        local_1c = 2;
      }
      else if (*in_RSI == 0) {
        local_1c = 3;
      }
    }
    else {
      iVar1 = strcmp((char *)*in_RDI,(char *)*in_RSI);
      local_1c = (uint)(iVar1 != 0);
    }
    if (in_RDI[1] != in_RSI[1]) {
      local_1c = local_1c + 10;
    }
    if (in_RDI[2] != in_RSI[2]) {
      local_1c = local_1c + 100;
    }
    if (in_RDI[3] != in_RSI[3]) {
      local_1c = local_1c + 1000;
    }
    if (in_RDI[4] != in_RSI[4]) {
      local_1c = local_1c + 2000;
    }
    if (in_RDI[5] != in_RSI[5]) {
      local_1c = local_1c + 3000;
    }
    if (local_1c == 0) {
      in_stack_ffffffffffffffd8 = (FmsDomain)in_RDI[4];
      for (in_stack_ffffffffffffffd0 = (FmsDomain)0x0;
          in_stack_ffffffffffffffd0 < in_stack_ffffffffffffffd8;
          in_stack_ffffffffffffffd0 = (FmsDomain)((long)in_stack_ffffffffffffffd0->num_entities + 1)
          ) {
        lVar2 = in_RDI[6] + (long)in_stack_ffffffffffffffd0 * 0xe8;
        lVar3 = in_RSI[6] + (long)in_stack_ffffffffffffffd0 * 0xe8;
        iVar1 = FmsDomainCompare(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
        if (iVar1 != 0) {
          local_1c = local_1c + 10000;
          break;
        }
        for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
          if (*(long *)(lVar2 + 8 + local_48 * 8) != *(long *)(lVar3 + 8 + local_48 * 8)) {
            local_1c = local_1c + 20000;
            break;
          }
          if (*(int *)(lVar2 + 0x48 + local_48 * 4) != *(int *)(lVar3 + 0x48 + local_48 * 4)) {
            local_1c = local_1c + 30000;
            break;
          }
          FVar4 = CompareIntData(in_stack_0000005c,in_stack_00000050,in_stack_00000048,
                                 in_stack_00000040);
          if (FVar4 != 0) {
            local_1c = local_1c + 40000;
            break;
          }
        }
        if (local_1c != 0) break;
      }
    }
    if ((local_1c == 0) &&
       (FVar4 = CompareIntData(in_stack_0000005c,in_stack_00000050,in_stack_00000048,
                               in_stack_00000040), FVar4 != 0)) {
      local_1c = 50000;
    }
    if ((local_1c == 0) &&
       (iVar1 = FmsFieldCompare((FmsField)in_stack_ffffffffffffffd8,
                                (FmsField)in_stack_ffffffffffffffd0), iVar1 != 0)) {
      local_1c = 60000;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int FmsComponentCompare(FmsComponent lhs, FmsComponent rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;

  if(lhs->name && rhs->name) {
    if(strcmp(lhs->name, rhs->name))
      diff += 1;
  } else if(!lhs->name)
    diff += 2;
  else if(!rhs->name)
    diff += 3;

  if(lhs->id != rhs->id)
    diff += 10;

  if(lhs->dim != rhs->dim)
    diff += 100;

  if(lhs->num_main_entities != rhs->num_main_entities)
    diff += 1000;

  if(lhs->num_parts != rhs->num_parts)
    diff += 2000;

  if(lhs->num_relations != rhs->num_relations)
    diff += 3000;

  if(diff == 0) {
    const FmsInt np = lhs->num_parts;
    for(FmsInt i = 0; i < np; i++) {
      const struct _FmsPart_private *lpart = &lhs->parts[i];
      const struct _FmsPart_private *rpart = &rhs->parts[i];
      if(FmsDomainCompare(lpart->domain, rpart->domain)) {
        diff += 10000;
        break;
      }
      for(FmsInt j = 0; j < FMS_NUM_ENTITY_TYPES; j++) {
        if(lpart->num_entities[j] != rpart->num_entities[j]) {
          diff += 20000;
          break;
        }
        if(lpart->entities_ids_type[j] != rpart->entities_ids_type[j]) {
          diff += 30000;
          break;
        }
        if(CompareIntData(lpart->entities_ids_type[j],
                          lpart->num_entities[j],
                          lpart->entities_ids[j], rpart->entities_ids[j])) {
          diff += 40000;
          break;
        }
      }
      if(diff)
        break;
    }
  }

  if(diff == 0) {
    if(CompareIntData(FMS_INT_TYPE, lhs->num_relations, lhs->relations,
                      rhs->relations))
      diff += 50000;
  }

  if(diff == 0) {
    // Ensure they refer to the same coordinates field
    if(FmsFieldCompare(lhs->coordinates, rhs->coordinates))
      diff += 60000;
  }

  return diff;
}